

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# const_mod.hpp
# Opt level: O0

uint boost::random::const_mod<unsigned_int,_2147483647U>::mult_add(uint a,uint x,uint c)

{
  unsigned_type uVar1;
  unsigned_type uVar2;
  uint in_EDX;
  int in_ESI;
  uint in_EDI;
  uint supress_warnings;
  uint in_stack_ffffffffffffffdc;
  uint in_stack_ffffffffffffffe0;
  undefined4 local_4;
  
  uVar1 = unsigned_m();
  uVar2 = unsigned_m();
  if ((uVar1 - 1 & uVar2) == 0) {
    uVar1 = unsigned_m();
    local_4 = in_EDI * in_ESI + in_EDX & uVar1 - 1;
  }
  else {
    local_4 = in_EDX;
    if (in_EDI != 0) {
      if ((-in_EDX - 1) / in_EDI < 0x7fffffff) {
        mult(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
        local_4 = add(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
      }
      else {
        local_4 = (in_EDI * in_ESI + in_EDX) % 0x7fffffff;
      }
    }
  }
  return local_4;
}

Assistant:

static IntType mult_add(IntType a, IntType x, IntType c)
  {
    if(((unsigned_m() - 1) & unsigned_m()) == 0)
      return (unsigned_type(a) * unsigned_type(x) + unsigned_type(c)) & (unsigned_m() - 1);
    else if(a == 0)
      return c;
    else if(m <= (traits::const_max-c)/a) {  // i.e. a*m+c <= max
      IntType supress_warnings = (m == 0);
      BOOST_ASSERT(supress_warnings == 0);
      return (a*x+c) % (m + supress_warnings);
    } else
      return add(mult(a, x), c);
  }